

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall cmSourceFile::CheckExtension(cmSourceFile *this)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_81;
  string local_80;
  string local_50 [32];
  undefined1 local_30 [8];
  string realExt;
  cmSourceFile *this_local;
  
  realExt.field_2._8_8_ = this;
  cmsys::SystemTools::GetFilenameLastExtension((string *)local_30,&this->FullPath);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_30);
    std::__cxx11::string::operator=((string *)&this->Extension,local_50);
    std::__cxx11::string::~string(local_50);
  }
  bVar1 = std::operator==(&this->Extension,"obj");
  if (((bVar1) || (bVar1 = std::operator==(&this->Extension,"o"), bVar1)) ||
     (bVar1 = std::operator==(&this->Extension,"lo"), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"EXTERNAL_OBJECT",&local_81);
    SetProperty(this,&local_80,"1");
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    CheckLanguage(this,&this->Extension);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmSourceFile::CheckExtension()
{
  // Compute the extension.
  std::string realExt =
    cmSystemTools::GetFilenameLastExtension(this->FullPath);
  if (!realExt.empty()) {
    // Store the extension without the leading '.'.
    this->Extension = realExt.substr(1);
  }

  // Look for object files.
  if (this->Extension == "obj" || this->Extension == "o" ||
      this->Extension == "lo") {
    this->SetProperty("EXTERNAL_OBJECT", "1");
  }

  // Try to identify the source file language from the extension.
  if (this->Language.empty()) {
    this->CheckLanguage(this->Extension);
  }
}